

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase::SectionNode::SectionNode(SectionNode *this,SectionStats *_stats)

{
  pointer pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  (this->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__SectionNode_0016b170;
  (this->stats)._vptr_SectionStats = (_func_int **)&PTR__SectionStats_0016b0f0;
  (this->stats).sectionInfo.name._M_dataplus._M_p = (pointer)&(this->stats).sectionInfo.name.field_2
  ;
  pcVar1 = (_stats->sectionInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->stats).sectionInfo,pcVar1,
             pcVar1 + (_stats->sectionInfo).name._M_string_length);
  (this->stats).sectionInfo.description._M_dataplus._M_p =
       (pointer)&(this->stats).sectionInfo.description.field_2;
  pcVar1 = (_stats->sectionInfo).description._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->stats).sectionInfo.description,pcVar1,
             pcVar1 + (_stats->sectionInfo).description._M_string_length);
  (this->stats).sectionInfo.lineInfo.file._M_dataplus._M_p =
       (pointer)&(this->stats).sectionInfo.lineInfo.file.field_2;
  pcVar1 = (_stats->sectionInfo).lineInfo.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->stats).sectionInfo.lineInfo,pcVar1,
             pcVar1 + (_stats->sectionInfo).lineInfo.file._M_string_length);
  (this->stats).sectionInfo.lineInfo.line = (_stats->sectionInfo).lineInfo.line;
  sVar2 = (_stats->assertions).failed;
  uVar3 = *(undefined8 *)((long)&(_stats->assertions).failed + 1);
  uVar4 = *(undefined8 *)((long)&_stats->durationInSeconds + 1);
  (this->stats).assertions.passed = (_stats->assertions).passed;
  (this->stats).assertions.failed = sVar2;
  *(undefined8 *)((long)&(this->stats).assertions.failed + 1) = uVar3;
  *(undefined8 *)((long)&(this->stats).durationInSeconds + 1) = uVar4;
  (this->childSections).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childSections).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childSections).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stdOut)._M_dataplus._M_p = (pointer)&(this->stdOut).field_2;
  (this->stdOut)._M_string_length = 0;
  (this->stdOut).field_2._M_local_buf[0] = '\0';
  (this->stdErr)._M_dataplus._M_p = (pointer)&(this->stdErr).field_2;
  (this->stdErr)._M_string_length = 0;
  (this->stdErr).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit SectionNode( SectionStats const& _stats ) : stats( _stats ) {}